

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O1

__ssize_t __thiscall
Common::TextFile::getline_abi_cxx11_(TextFile *this,char **__lineptr,size_t *__n,FILE *__stream)

{
  char cVar1;
  bool bVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  char *__s;
  ulong uVar6;
  string *psVar7;
  ulong uVar8;
  size_t __n_00;
  _List_node_base *p_Var9;
  charptr result;
  list<Common::charptr,_std::allocator<Common::charptr>_> strlist;
  allocator local_69;
  _List_node_base *local_68;
  _List_node_base *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_58;
  string *local_50;
  _List_base<Common::charptr,_std::allocator<Common::charptr>_> local_48;
  
  local_48._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_48;
  local_48._M_impl._M_node._M_size = 0;
  uVar6 = 0;
  local_50 = (string *)this;
  local_48._M_impl._M_node.super__List_node_base._M_prev =
       local_48._M_impl._M_node.super__List_node_base._M_next;
  do {
    local_68 = (_List_node_base *)0x101;
    p_Var4 = (_List_node_base *)operator_new__(0x101);
    memset(p_Var4,0,0x101);
    local_60 = p_Var4;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<char*,void(*)(char*),std::allocator<void>,void>
              (&_Stack_58,p_Var4,Memory::delete_<char>);
    p_Var4 = (_List_node_base *)operator_new(0x28);
    _Var3._M_pi = _Stack_58._M_pi;
    p_Var4[1]._M_next = local_68;
    p_Var4[2]._M_next = (_List_node_base *)0x0;
    _Stack_58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var4[1]._M_prev = local_60;
    p_Var4[2]._M_next = (_List_node_base *)_Var3._M_pi;
    local_60 = (_List_node_base *)0x0;
    std::__detail::_List_node_base::_M_hook(p_Var4);
    local_48._M_impl._M_node._M_size = local_48._M_impl._M_node._M_size + 1;
    if (_Stack_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_58._M_pi);
    }
    p_Var9 = local_48._M_impl._M_node.super__List_node_base._M_prev;
    fgets((char *)local_48._M_impl._M_node.super__List_node_base._M_prev[1]._M_prev,0x101,
          (FILE *)*__lineptr);
    p_Var4 = p_Var9[1]._M_prev;
    cVar1 = *(char *)((long)&p_Var4[0xf]._M_prev + 7);
    if ((cVar1 == '\n') || (cVar1 == '\0')) {
      p_Var5 = (_List_node_base *)strlen((char *)p_Var4);
      p_Var4 = p_Var9[1]._M_next;
      if (p_Var5 < p_Var4) {
        p_Var4 = p_Var5;
      }
      bVar2 = false;
    }
    else {
      p_Var4 = (_List_node_base *)0x100;
      bVar2 = true;
    }
    psVar7 = local_50;
    uVar6 = (long)&p_Var4->_M_next + uVar6;
  } while (bVar2);
  if (uVar6 == 0) {
    *(string **)local_50 = local_50 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>(local_50,"");
  }
  else {
    p_Var4 = (_List_node_base *)(uVar6 + 1);
    local_68 = p_Var4;
    __s = (char *)operator_new__((ulong)p_Var4);
    memset(__s,0,(size_t)p_Var4);
    local_60 = (_List_node_base *)__s;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<char*,void(*)(char*),std::allocator<void>,void>
              (&_Stack_58,__s,Memory::delete_<char>);
    uVar8 = uVar6;
    p_Var4 = local_48._M_impl._M_node.super__List_node_base._M_next;
    p_Var9 = local_60;
    if (local_48._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_48) {
      do {
        __n_00 = 0x100;
        if (uVar8 < 0x100) {
          __n_00 = uVar8;
        }
        memcpy(p_Var9,p_Var4[1]._M_prev,__n_00);
        p_Var4 = (((_List_impl *)&p_Var4->_M_next)->_M_node).super__List_node_base._M_next;
        uVar8 = uVar8 - __n_00;
        p_Var9 = (_List_node_base *)((long)p_Var9 + __n_00);
      } while (p_Var4 != (_List_node_base *)&local_48);
    }
    psVar7 = local_50;
    if (*(char *)((long)local_60 + (uVar6 - 1)) == '\n') {
      *(char *)((long)local_60 + (uVar6 - 1)) = '\0';
    }
    if ((uVar6 != 1) && (*(char *)((long)local_60 + (uVar6 - 2)) == '\r')) {
      *(char *)((long)local_60 + (uVar6 - 2)) = '\0';
    }
    std::__cxx11::string::string(local_50,(char *)local_60,&local_69);
    if (_Stack_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_58._M_pi);
    }
  }
  std::__cxx11::_List_base<Common::charptr,_std::allocator<Common::charptr>_>::_M_clear(&local_48);
  return (__ssize_t)psVar7;
}

Assistant:

std::string TextFile::getline() {
	std::list<charptr> strlist;
	const size_t size = 0x100;
	size_t length = 0;

	while (true) {
		strlist.push_back(charptr(size));
		charptr &buffer = strlist.back();

		fgets(buffer.get(), size + 1, _file.get());

		// Line:
		//  Linux:   \n
		//  Windows: \r\n

		char c = buffer[size - 1];
		if (c == '\0' || c == '\n') {
			length += buffer.length();
			break;
		}
		else {
			length += size;
		}
	}

	if (length == 0)
		return "";

	charptr result(length); // The std::string end without '\0'
	size_t reclen = length;

	auto iter = result.get();

	for (auto &str : strlist) {
		size_t step = reclen < size ? reclen : size;
		std::memcpy(iter, str.get(), step);
		iter += step;
		reclen -= step;
	}

	// Remove \n, \r
	if (result[length - 1] == '\n')
		result[length - 1] = '\0';
	if (length >= 2 && result[length - 2] == '\r')
		result[length - 2] = '\0';

	return result.get(); // Remove '\0
}